

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

bool idx2::ToDouble(stref *Str,f64 *Result)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  double dVar5;
  char *EndPtr;
  char *local_18;
  
  bVar2 = false;
  if (((Str->field_0).Ptr != (char *)0x0) && (bVar2 = false, 0 < Str->Size)) {
    local_18 = (char *)0x0;
    dVar5 = strtod((Str->field_0).Ptr,&local_18);
    *Result = (f64)dVar5;
    piVar4 = __errno_location();
    if (*piVar4 == 0x22) {
      bVar2 = false;
    }
    else {
      bVar2 = false;
      if ((local_18 != (char *)0x0) && (local_18 != (Str->field_0).Ptr)) {
        cVar1 = *local_18;
        iVar3 = isspace((int)cVar1);
        bVar2 = true;
        if (iVar3 == 0) {
          iVar3 = ispunct((int)cVar1);
          bVar2 = cVar1 == '\0' || iVar3 != 0;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool
ToDouble(const stref& Str, f64* Result)
{
  if (!Str || Str.Size <= 0)
    return false;
  char* EndPtr = nullptr;
  *Result = strtod(Str.ConstPtr, &EndPtr);
  bool Failure = errno == ERANGE || EndPtr == Str.ConstPtr || !EndPtr ||
                 !(isspace(*EndPtr) || ispunct(*EndPtr) || (*EndPtr) == 0);
  return !Failure;
}